

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mi.h
# Opt level: O1

bool __thiscall
GF2::MI<6UL,_GF2::MOGrevlex<6UL>_>::Reduce(MI<6UL,_GF2::MOGrevlex<6UL>_> *this,iterator pos)

{
  _List_node_base *p_Var1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  MM<6UL> lm;
  MP<6UL,_GF2::MOGrevlex<6UL>_> poly;
  Geobucket<2UL> gb;
  WW<6UL> local_90;
  MP<6UL,_GF2::MOGrevlex<6UL>_> local_88;
  _List_node_base *local_68;
  Geobucket<2UL> local_60;
  
  p_Var5 = pos._M_node + 1;
  MP<6UL,_GF2::MOGrevlex<6UL>_>::Geobucket<2UL>::Geobucket
            (&local_60,(MP<6UL,_GF2::MOGrevlex<6UL>_> *)p_Var5);
  local_68 = p_Var5;
  std::__cxx11::list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::clear
            ((list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *)p_Var5);
  local_90._words[0] = (word  [1])0;
  local_88.super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>.
  super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&local_88;
  bVar3 = false;
  local_88.super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>.
  super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>._M_impl._M_node._M_size = 0;
  local_88.super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>.
  super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       local_88.super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>.
       super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>._M_impl._M_node.
       super__List_node_base._M_next;
  do {
    bVar2 = MP<6UL,_GF2::MOGrevlex<6UL>_>::Geobucket<2UL>::PopLM(&local_60,(MM<6UL> *)&local_90);
    p_Var5 = local_88.super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>.
             super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>._M_impl._M_node.
             super__List_node_base._M_next;
    if (!bVar2) {
      while (p_Var5 != (_List_node_base *)&local_88) {
        p_Var6 = p_Var5->_M_next;
        operator_delete(p_Var5,0x18);
        p_Var5 = p_Var6;
      }
      if (local_60._maxsizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60._maxsizes.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_60._maxsizes.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_60._maxsizes.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
      ::~vector(&local_60._buckets);
      return bVar3;
    }
    p_Var5 = (this->
             super_list<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
             ).
             super__List_base<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>,_std::allocator<GF2::MP<6UL,_GF2::MOGrevlex<6UL>_>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
LAB_00136be4:
    p_Var6 = p_Var5;
    if (p_Var5 == (_List_node_base *)this) goto LAB_00136ca8;
    if (p_Var5 == pos._M_node) {
LAB_00136c1f:
      p_Var5 = p_Var5->_M_next;
      goto LAB_00136be4;
    }
    iVar4 = MOGrevlex<6UL>::Compare
                      ((MOGrevlex<6UL> *)&this->field_0x18,(MM<6UL> *)(p_Var5[1]._M_next + 1),
                       (MM<6UL> *)&local_90);
    p_Var6 = (_List_node_base *)this;
    if (0 < iVar4) goto LAB_00136ca8;
    p_Var6 = p_Var5 + 1;
    p_Var1 = (((list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *)&p_Var6->_M_next)->
             super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>)._M_impl._M_node.
             super__List_node_base._M_next;
    if (((ulong)p_Var1[1]._M_next & ~(ulong)local_90._words[0]) != 0) goto LAB_00136c1f;
    if (p_Var6 != (_List_node_base *)&local_88) {
      std::__cxx11::list<GF2::MM<6ul>,std::allocator<GF2::MM<6ul>>>::
      _M_assign_dispatch<std::_List_const_iterator<GF2::MM<6ul>>>
                ((list<GF2::MM<6ul>,std::allocator<GF2::MM<6ul>>> *)&local_88,p_Var1,p_Var6);
    }
    p_Var1 = local_88.super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>.
             super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>._M_impl._M_node.
             super__List_node_base._M_next;
    local_88.super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>.
    super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>._M_impl._M_node._M_size =
         local_88.super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>.
         super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>._M_impl._M_node._M_size - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var1,0x18);
    local_90._words[0] =
         (word  [1])
         (~(ulong)(((list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *)&p_Var6->_M_next)->
                  super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>)._M_impl._M_node.
                  super__List_node_base._M_next[1]._M_next & (ulong)local_90._words[0]);
    for (p_Var6 = local_88.super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>.
                  super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>._M_impl._M_node.
                  super__List_node_base._M_next; p_Var6 != (_List_node_base *)&local_88;
        p_Var6 = (((list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *)&p_Var6->_M_next)->
                 super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>)._M_impl._M_node.
                 super__List_node_base._M_next) {
      p_Var6[1]._M_next = (_List_node_base *)((ulong)p_Var6[1]._M_next | (ulong)local_90._words[0]);
    }
    MP<6UL,_GF2::MOGrevlex<6UL>_>::Normalize(&local_88);
    bVar3 = true;
    MP<6UL,_GF2::MOGrevlex<6UL>_>::Geobucket<2UL>::SymDiffSplice(&local_60,&local_88);
    p_Var6 = p_Var5;
LAB_00136ca8:
    if (p_Var6 == (_List_node_base *)this) {
      p_Var5 = (_List_node_base *)operator_new(0x18);
      p_Var5[1]._M_next = (_List_node_base *)local_90._words[0];
      std::__detail::_List_node_base::_M_hook(p_Var5);
      pos._M_node[2]._M_next = (_List_node_base *)((long)&(pos._M_node[2]._M_next)->_M_next + 1);
    }
  } while( true );
}

Assistant:

bool Reduce(iterator pos)
	{	
		typename MP<_n, _O>::template Geobucket<2> gb(*pos);
		// будем сохранять в *pos остаток
		pos->SetEmpty();
		// цикл деления
		bool changed = false;
		MM<_n> lm;
		MP<_n, _O> poly(_order);
		while (gb.PopLM(lm))
		{
			iterator iterPoly = begin();
			for (; iterPoly != end(); ++iterPoly)
			{
				// пропускаем многочлен в позиции pos
				if (iterPoly == pos) continue;
				// все остальное без изменений
				if (_order.Compare(iterPoly->LM(), lm) > 0)
				{
					iterPoly = end();
					break;
				}
				else if (iterPoly->LM() | lm)
				{
					changed = true;
					(poly = *iterPoly).PopLM();
					gb.SymDiffSplice(poly *= (lm /= iterPoly->LM()));
					break;
				}
			}
			if (iterPoly == end()) pos->push_back(lm);
		}
		return changed;
	}